

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

uint64_t __thiscall r_exec::_Mem::start(_Mem *this)

{
  Group *g_00;
  _Mem *p_Var1;
  bool bVar2;
  uint32_t uVar3;
  ModelBase *this_00;
  size_type sVar4;
  reference ppGVar5;
  Controller *pCVar6;
  TimeJob *pTVar7;
  View *pVVar8;
  Code *pCVar9;
  pointer pvVar10;
  View *pVVar11;
  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  *this_01;
  UpdateJob *this_02;
  uint64_t uVar12;
  PerfSamplingJob *this_03;
  reference ppVar13;
  uint16_t index;
  uint16_t index_00;
  float fVar14;
  float fVar15;
  pair<r_exec::View_*,_r_exec::Group_*> *initial_reduction_job;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
  *__range1;
  thread local_110;
  _func_void *local_108;
  thread local_100;
  pair<r_exec::View_*,_r_exec::Group_*> local_f8;
  _Base_ptr local_e8;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_e0;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_d8;
  const_iterator end_1;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_c8;
  const_iterator v_2;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> _Stack_b8;
  uint8_t selector_1;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_b0;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_98;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_88;
  const_iterator v_1;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_78;
  const_iterator end;
  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
  local_68;
  const_iterator v;
  uint8_t selector;
  bool c_salient;
  Group *pGStack_58;
  bool c_active;
  Group *g;
  _Mem *local_40;
  uint64_t now;
  uint64_t i;
  vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
  initial_reduction_jobs;
  _Mem *this_local;
  
  if ((this->state == STOPPED) || (this->state == NOT_STARTED)) {
    initial_reduction_jobs.
    super__Vector_base<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::__atomic_base<unsigned_long>::operator=
              (&(this->m_coreCount).super___atomic_base<unsigned_long>,0);
    std::
    vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ::vector((vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
              *)&i);
    local_40 = (_Mem *)(*Now)();
    r_code::Utils::SetTimeReference((ulong)local_40);
    this_00 = ModelBase::Get();
    ModelBase::set_thz(this_00,this->secondary_thz);
    init_timings(this,(uint64_t)local_40);
    for (now = 0; uVar12 = now,
        sVar4 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                          (&this->initial_groups), uVar12 < sVar4; now = now + 1) {
      ppGVar5 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                          (&this->initial_groups,now);
      pGStack_58 = *ppGVar5;
      fVar14 = Group::get_c_act(pGStack_58);
      fVar15 = Group::get_c_act_thr(pGStack_58);
      v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur._7_1_ = fVar15 < fVar14;
      fVar14 = Group::get_c_sln(pGStack_58);
      fVar15 = Group::get_c_sln_thr(pGStack_58);
      v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur._6_1_ = fVar15 < fVar14;
      end.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::begin(&pGStack_58->ipgm_views);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                (&local_68,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&end);
      v_1.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
               std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::end(&pGStack_58->ipgm_views);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                (&local_78,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&v_1);
      v.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
      _M_cur._5_1_ = 0;
      while (bVar2 = Group::all_views_cond
                               (pGStack_58,
                                (uint8_t *)
                                ((long)&v.
                                        super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                        ._M_cur + 5),&local_68,&local_78), bVar2) {
        pvVar10 = std::__detail::
                  _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  ::operator->(&local_68);
        pVVar11 = core::P::operator_cast_to_View_((P *)&pvVar10->second);
        r_code::Utils::SetIndirectTimestamp<r_exec::View>(pVVar11,2,(uint64_t)local_40);
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        operator++(&local_68);
      }
      if ((v.
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
           _M_cur._7_1_ & 1) != 0) {
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        _Node_const_iterator
                  ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_88);
        local_98._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::begin(&pGStack_58->input_less_ipgm_views);
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        _Node_const_iterator
                  ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_90,
                   (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_98);
        local_88._M_cur = local_90._M_cur;
        while( true ) {
          local_a0._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::end(&pGStack_58->input_less_ipgm_views);
          bVar2 = std::__detail::operator!=(&local_88,&local_a0);
          if (!bVar2) break;
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                  *)&local_88);
          pVVar11 = core::P<r_exec::View>::operator->(&pvVar10->second);
          bVar2 = core::P<r_exec::Controller>::operator!=(&pVVar11->controller,(Controller *)0x0);
          if (bVar2) {
            pvVar10 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                    *)&local_88);
            pVVar11 = core::P<r_exec::View>::operator->(&pvVar10->second);
            pCVar6 = core::P<r_exec::Controller>::operator->(&pVVar11->controller);
            bVar2 = Controller::is_activated(pCVar6);
            if (bVar2) {
              pTVar7 = (TimeJob *)operator_new(0x28);
              pvVar10 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                      *)&local_88);
              pVVar11 = core::P::operator_cast_to_View_((P *)&pvVar10->second);
              p_Var1 = local_40;
              pvVar10 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                      *)&local_88);
              pVVar8 = core::P<r_exec::View>::operator->(&pvVar10->second);
              pCVar9 = core::P::operator_cast_to_Code_((P *)&(pVVar8->super_View).object);
              uVar12 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar9,(Code *)0x4,index);
              InputLessPGMSignalingJob::InputLessPGMSignalingJob
                        ((InputLessPGMSignalingJob *)pTVar7,pVVar11,
                         (uint64_t)(&p_Var1->super_Mem + uVar12));
              pushTimeJob(this,pTVar7);
            }
          }
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
          ::operator++((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        *)&local_88);
        }
        local_b0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::begin(&pGStack_58->anti_ipgm_views);
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        _Node_const_iterator
                  ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_a8,
                   (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_b0);
        local_88._M_cur = local_a8._M_cur;
        while( true ) {
          _Stack_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::end(&pGStack_58->anti_ipgm_views);
          bVar2 = std::__detail::operator!=(&local_88,&stack0xffffffffffffff48);
          if (!bVar2) break;
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                  *)&local_88);
          pVVar11 = core::P<r_exec::View>::operator->(&pvVar10->second);
          bVar2 = core::P<r_exec::Controller>::operator!=(&pVVar11->controller,(Controller *)0x0);
          if (bVar2) {
            pvVar10 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                    *)&local_88);
            pVVar11 = core::P<r_exec::View>::operator->(&pvVar10->second);
            pCVar6 = core::P<r_exec::Controller>::operator->(&pVVar11->controller);
            bVar2 = Controller::is_activated(pCVar6);
            if (bVar2) {
              pTVar7 = (TimeJob *)operator_new(0x28);
              pvVar10 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                      *)&local_88);
              pVVar11 = core::P::operator_cast_to_View_((P *)&pvVar10->second);
              p_Var1 = local_40;
              pvVar10 = std::__detail::
                        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                                      *)&local_88);
              pVVar8 = core::P<r_exec::View>::operator->(&pvVar10->second);
              pCVar9 = core::P::operator_cast_to_Code_((P *)&(pVVar8->super_View).object);
              uVar12 = r_code::Utils::GetTimestamp<r_code::Code>
                                 ((Utils *)pCVar9,(Code *)0x4,index_00);
              AntiPGMSignalingJob::AntiPGMSignalingJob
                        ((AntiPGMSignalingJob *)pTVar7,pVVar11,
                         (uint64_t)(&p_Var1->super_Mem + uVar12));
              pushTimeJob(this,pTVar7);
            }
          }
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
          ::operator++((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                        *)&local_88);
        }
      }
      if ((v.
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
           _M_cur._6_1_ & 1) != 0) {
        end_1.
        super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                 )std::
                  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
                  ::begin(&pGStack_58->ipgm_views);
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        _Node_const_iterator
                  (&local_c8,
                   (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&end_1);
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::end(&pGStack_58->ipgm_views);
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
        _Node_const_iterator
                  (&local_d8,
                   (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    *)&local_e0);
        v_2.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
        ._M_cur._7_1_ = 0;
        while (bVar2 = Group::all_views_cond
                                 (pGStack_58,
                                  (uint8_t *)
                                  ((long)&v_2.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                          ._M_cur + 7),&local_c8,&local_d8), bVar2) {
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                    ::operator->(&local_c8);
          pVVar11 = core::P<r_exec::View>::operator->(&pvVar10->second);
          fVar14 = View::get_sln(pVVar11);
          fVar15 = Group::get_sln_thr(pGStack_58);
          if (fVar15 < fVar14) {
            this_01 = &pGStack_58->newly_salient_views;
            pvVar10 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->(&local_c8);
            local_e8 = (_Base_ptr)
                       std::
                       multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                       ::insert(this_01,&pvVar10->second);
            pvVar10 = std::__detail::
                      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                      ::operator->(&local_c8);
            std::pair<r_exec::View_*,_r_exec::Group_*>::
            pair<const_core::P<r_exec::View>_&,_r_exec::Group_*&,_true>
                      (&local_f8,&pvVar10->second,&stack0xffffffffffffffa8);
            std::
            vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
            ::push_back((vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                         *)&i,&local_f8);
          }
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
          ::operator++(&local_c8);
        }
      }
      uVar3 = Group::get_upr(pGStack_58);
      if (uVar3 != 0) {
        this_02 = (UpdateJob *)operator_new(0x28);
        g_00 = pGStack_58;
        uVar12 = Group::get_next_upr_time(pGStack_58,(uint64_t)local_40);
        UpdateJob::UpdateJob(this_02,g_00,uVar12);
        pushTimeJob(this,(TimeJob *)this_02);
      }
    }
    std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::clear(&this->initial_groups);
    this->state = RUNNING;
    this_03 = (PerfSamplingJob *)operator_new(0x28);
    PerfSamplingJob::PerfSamplingJob
              (this_03,(uint64_t)(&local_40->super_Mem + this->perf_sampling_period),
               this->perf_sampling_period);
    pushTimeJob(this,(TimeJob *)this_03);
    for (now = 0; now < this->reduction_core_count; now = now + 1) {
      local_108 = runReductionCore;
      std::thread::thread<void(*)(),,void>(&local_100,&local_108);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                (&this->m_coreThreads,&local_100);
      std::thread::~thread(&local_100);
    }
    for (now = 0; now < this->time_core_count; now = now + 1) {
      __range1 = (vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                  *)runTimeCore;
      std::thread::thread<void(*)(),,void>(&local_110,(_func_void **)&__range1);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                (&this->m_coreThreads,&local_110);
      std::thread::~thread(&local_110);
    }
    __end1 = std::
             vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
             ::begin((vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                      *)&i);
    initial_reduction_job =
         (pair<r_exec::View_*,_r_exec::Group_*> *)
         std::
         vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
         ::end((vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
                *)&i);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<r_exec::View_*,_r_exec::Group_*>_*,_std::vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>_>
                                       *)&initial_reduction_job), bVar2) {
      ppVar13 = __gnu_cxx::
                __normal_iterator<std::pair<r_exec::View_*,_r_exec::Group_*>_*,_std::vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>_>
                ::operator*(&__end1);
      Group::inject_reduction_jobs(ppVar13->second,ppVar13->first);
      __gnu_cxx::
      __normal_iterator<std::pair<r_exec::View_*,_r_exec::Group_*>_*,_std::vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>_>
      ::operator++(&__end1);
    }
    this_local = local_40;
    std::
    vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
    ::~vector((vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
               *)&i);
  }
  else {
    this_local = (_Mem *)0x0;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t _Mem::start()
{
    if (state != STOPPED && state != NOT_STARTED) {
        return 0;
    }

    m_coreCount = 0;
    std::vector<std::pair<View *, Group *> > initial_reduction_jobs;
    uint64_t i;
    uint64_t now = Now();
    Utils::SetTimeReference(now);
    ModelBase::Get()->set_thz(secondary_thz);
    init_timings(now);

    for (i = 0; i < initial_groups.size(); ++i) {
        Group *g = initial_groups[i];
        bool c_active = g->get_c_act() > g->get_c_act_thr();
        bool c_salient = g->get_c_sln() > g->get_c_sln_thr();
        FOR_ALL_VIEWS_BEGIN(g, v)
        Utils::SetIndirectTimestamp<View>(v->second, VIEW_IJT, now); // init injection time for the view.
        FOR_ALL_VIEWS_END

        if (c_active) {
            std::unordered_map<uint64_t, P<View> >::const_iterator v;

            // build signaling jobs for active input-less overlays.
            for (v = g->input_less_ipgm_views.begin(); v != g->input_less_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new InputLessPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }

            // build signaling jobs for active anti-pgm overlays.
            for (v = g->anti_ipgm_views.begin(); v != g->anti_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new AntiPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }
        }

        if (c_salient) {
            // build reduction jobs for each salient view and each active overlay - regardless of the view's sync mode.
            FOR_ALL_VIEWS_BEGIN(g, v)

            if (v->second->get_sln() > g->get_sln_thr()) { // salient view.
                g->newly_salient_views.insert(v->second);
                initial_reduction_jobs.push_back(std::pair<View *, Group *>(v->second, g));
            }

            FOR_ALL_VIEWS_END
        }

        if (g->get_upr() > 0) { // inject the next update job for the group.
            pushTimeJob(new UpdateJob(g, g->get_next_upr_time(now)));
        }
    }

    initial_groups.clear();
    state = RUNNING;
    pushTimeJob(new PerfSamplingJob(now + perf_sampling_period, perf_sampling_period));

    for (i = 0; i < reduction_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runReductionCore));
    }

    for (i = 0; i < time_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runTimeCore));
    }

    for (auto & initial_reduction_job : initial_reduction_jobs) {
        initial_reduction_job.second->inject_reduction_jobs(initial_reduction_job.first);
    }

    return now;
}